

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Matrix<float,3,4,0,3,4>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>const,3,4,false>,float,float>
               (Matrix<float,_3,_4,_0,_3,_4> *dst,
               Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false> *src,
               assign_op<float,_float> *param_3)

{
  Index IVar1;
  Index cols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<float,_float> *param_2_local;
  Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false> *src_local;
  Matrix<float,_3,_4,_0,_3,_4> *dst_local;
  
  IVar1 = MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_0>::rows
                    ((MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_0>
                      *)src);
  cols = MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_0>::cols
                   ((MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_0>
                     *)src);
  IVar2 = PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>);
  if (IVar2 == IVar1) {
    IVar2 = PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>);
    if (IVar2 == cols) goto LAB_0023081d;
  }
  PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>::resize
            (&dst->super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>,IVar1,cols);
LAB_0023081d:
  IVar2 = PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>);
    bVar3 = IVar1 == cols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, 3, 4>, SrcXprType = Eigen::Block<const Eigen::Matrix<float, 4, 4>, 3, 4>, T1 = float, T2 = float]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}